

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O2

void __thiscall
cmsys::Encoding::CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  pointer ppcVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3);
      uVar2 = uVar2 + 1) {
    free(ppcVar1[uVar2]);
  }
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            ((_Vector_base<char_*,_std::allocator<char_*>_> *)this);
  return;
}

Assistant:

Encoding::CommandLineArguments::~CommandLineArguments()
{
  for (size_t i = 0; i < this->argv_.size(); i++) {
    free(argv_[i]);
  }
}